

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

TPZVec<float> * __thiscall
TPZVec<float>::operator=(TPZVec<float> *this,initializer_list<float> *list)

{
  iterator pfVar1;
  size_type sVar2;
  float *pfVar3;
  long lVar4;
  
  (*this->_vptr_TPZVec[3])();
  pfVar1 = list->_M_array;
  sVar2 = list->_M_len;
  pfVar3 = this->fStore;
  for (lVar4 = 0; sVar2 << 2 != lVar4; lVar4 = lVar4 + 4) {
    *(undefined4 *)((long)pfVar3 + lVar4) = *(undefined4 *)((long)pfVar1 + lVar4);
  }
  return this;
}

Assistant:

TPZVec<T> &TPZVec<T>::operator=(const std::initializer_list<T> &list) {
	Resize(list.size());

	auto it = list.begin();
	auto it_end = list.end();
	auto *aux = fStore;

	for (; it != it_end; it++, aux++)
		*aux = *it;
	return *this;
}